

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<double> __thiscall Omega_h::array_cast<double,int>(Omega_h *this,Read<int> *in)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  Read<double> RVar3;
  type f;
  Write<double> out;
  allocator local_59;
  string local_58;
  Write<double> local_38;
  Write<signed_char> local_28;
  
  pAVar1 = (in->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  Write<double>::Write(&local_38,(LO)(sVar2 >> 2),&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<double>::Write((Write<double> *)&local_58,&local_38);
  Write<int>::Write((Write<int> *)&local_58.field_2,&in->write_);
  pAVar1 = (in->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  parallel_for<Omega_h::array_cast<double,int>(Omega_h::Read<int>)::_lambda(int)_1_>
            ((LO)(sVar2 >> 2),(type *)&local_58,"array_cast");
  Write<double>::Write(&local_28,(Write<signed_char> *)&local_38);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_28);
  Write<double>::~Write((Write<double> *)&local_28);
  array_cast<double,int>(Omega_h::Read<int>)::{lambda(int)#1}::~Read((_lambda_int__1_ *)&local_58);
  Write<double>::~Write(&local_38);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<double>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<Tout> array_cast(Read<Tin> in) {
  auto out = Write<Tout>(in.size());
  auto f = OMEGA_H_LAMBDA(LO i) { out[i] = static_cast<Tout>(in[i]); };
  parallel_for(in.size(), f, "array_cast");
  return out;
}